

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-get-attr.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  BigAttr *pBVar5;
  int iVar6;
  BigAttr *attr_1;
  BigAttr *attr;
  BigAttr *attrs;
  size_t nattr;
  int i;
  int opt;
  BigBlock bb;
  BigFile bf;
  char **argv_local;
  int argc_local;
  
  memset(&bb.dirty,0,8);
  memset(&i,0,0x50);
  while (nattr._4_4_ = getopt(argc,argv,"l"), nattr._4_4_ != -1) {
    if (nattr._4_4_ == 0x6c) {
      longfmt = 1;
    }
    else {
      usage();
    }
  }
  iVar6 = _optind + -1;
  if (argc - _optind < 2) {
    usage();
  }
  iVar3 = big_file_open((BigFile *)&bb.dirty,argv[(long)iVar6 + 1]);
  pFVar2 = _stderr;
  if (iVar3 == 0) {
    iVar3 = big_file_open_block((BigFile *)&bb.dirty,(BigBlock *)&i,argv[(long)iVar6 + 2]);
    pFVar2 = _stderr;
    if (iVar3 == 0) {
      if (argc - _optind == 2) {
        pBVar5 = big_block_list_attrs((BigBlock *)&i,(size_t *)&attrs);
        for (nattr._0_4_ = 0; (BigAttr *)(long)(int)nattr < attrs; nattr._0_4_ = (int)nattr + 1) {
          print_attr(pBVar5 + (int)nattr,0);
        }
      }
      for (nattr._0_4_ = 3; (int)nattr < (argc - _optind) + 1; nattr._0_4_ = (int)nattr + 1) {
        pBVar5 = big_block_lookup_attr((BigBlock *)&i,argv[(long)iVar6 + (long)(int)nattr]);
        if (pBVar5 == (BigAttr *)0x0) {
          printf("%s, not attr:\n",argv[(long)iVar6 + (long)(int)nattr]);
        }
        else {
          print_attr(pBVar5,(uint)(argc - _optind == 3));
        }
      }
      big_block_close((BigBlock *)&i);
      big_file_close((BigFile *)&bb.dirty);
      return 0;
    }
    pcVar1 = argv[(long)iVar6 + 2];
    pcVar4 = big_file_get_error_message();
    fprintf(pFVar2,"failed to open block: %s %s\n",pcVar1,pcVar4);
    exit(1);
  }
  pcVar1 = argv[(long)iVar6 + 1];
  pcVar4 = big_file_get_error_message();
  fprintf(pFVar2,"failed to open file : %s %s\n",pcVar1,pcVar4);
  exit(1);
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigBlock bb = {0};

    int opt;
    while(-1 != (opt = getopt(argc, argv, "l"))) {
        switch(opt) {
            case 'l':
                longfmt = 1;
                break;
            default:
                usage();
        }
    }
    argv += optind - 1;
    if(argc - optind < 2) {
        usage();
    }

    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open file : %s %s\n", argv[1], big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open block: %s %s\n", argv[2], big_file_get_error_message());
        exit(1);
    }
    int i; 
    if(argc - optind == 2) {
        size_t nattr;
        BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
        for(i = 0; i < nattr; i ++) {
            BigAttr * attr = &attrs[i];
            print_attr(attr, 0);
        }
    }
    for(i = 3; i < argc - optind + 1; i ++) {
        BigAttr * attr = big_block_lookup_attr(&bb, argv[i]);
        if(attr) {
            print_attr(attr, argc - optind == 3);
        } else {
            printf("%s, not attr:\n", argv[i]);
        }
    }
    big_block_close(&bb);
    big_file_close(&bf);
    return 0;
}